

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O2

void cmd_init(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint uVar3;
  long lVar4;
  cmd_info_conflict ***pppcVar5;
  cmd_info_conflict **ppcVar6;
  cmd_info_conflict *pcVar7;
  size_t sVar8;
  keycode_t kVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar10 = 0;
  memset(converted_list,0,0x1000);
  if (nested_lists != (cmd_info_conflict ***)0x0) {
    for (uVar11 = 0; uVar11 < (uint)n_nested; uVar11 = uVar11 + 1) {
      mem_free(nested_lists[uVar11]);
    }
    nested_lists = (cmd_info_conflict ***)0x0;
  }
  for (lVar4 = 0; n_nested = (wchar_t)uVar10, lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
    wVar1 = *(wchar_t *)((long)&cmds_all[0].keymap + lVar4);
    if (n_nested <= wVar1) {
      uVar10 = (ulong)(uint)wVar1;
    }
  }
  if (n_nested < L'\x01') {
    pppcVar5 = (cmd_info_conflict ***)0x0;
  }
  else {
    pppcVar5 = (cmd_info_conflict ***)mem_zalloc(uVar10 << 3);
    nested_lists = pppcVar5;
    for (uVar10 = 0; uVar10 < (uint)n_nested; uVar10 = uVar10 + 1) {
      ppcVar6 = (cmd_info_conflict **)mem_zalloc(0x800);
      pppcVar5 = nested_lists;
      nested_lists[uVar10] = ppcVar6;
    }
  }
  wVar1 = n_nested;
  lVar4 = 0;
  do {
    if (lVar4 == 0x10) {
      return;
    }
    pcVar7 = cmds_all[lVar4].list;
    wVar2 = cmds_all[lVar4].keymap;
    if ((ulong)(uint)wVar2 == 0) {
      sVar8 = cmds_all[lVar4].len;
      while (bVar12 = sVar8 != 0, sVar8 = sVar8 - 1, bVar12) {
        uVar3 = pcVar7->key[0];
        kVar9 = pcVar7->key[1];
        if (pcVar7->key[1] == 0) {
          pcVar7->key[1] = uVar3;
          kVar9 = uVar3;
        }
        if (kVar9 != 0 && uVar3 != 0) {
          converted_list[0][uVar3] = pcVar7;
          converted_list[1][kVar9] = pcVar7;
        }
        pcVar7 = pcVar7 + 1;
      }
    }
    else if (L'\0' < wVar2) {
      if (wVar1 < wVar2) {
        __assert_fail("kidx < n_nested",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                      ,0x1a4,"void cmd_init(void)");
      }
      sVar8 = cmds_all[lVar4].len;
      while (bVar12 = sVar8 != 0, sVar8 = sVar8 - 1, bVar12) {
        uVar3 = pcVar7->key[0];
        pcVar7->key[1] = uVar3;
        if (pppcVar5[(ulong)(uint)wVar2 - 1][uVar3] != (cmd_info_conflict *)0x0) {
          __assert_fail("!nested_lists[kidx][commands[i].key[0]]",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                        ,0x1b0,"void cmd_init(void)");
        }
        pppcVar5[(ulong)(uint)wVar2 - 1][uVar3] = pcVar7;
        pcVar7 = pcVar7 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void cmd_init(void)
{
	size_t i, j;

	memset(converted_list, 0, sizeof(converted_list));

	/* Set up storage for the nested command lists */
	if (nested_lists != NULL) {
		assert(n_nested >= 0);
		for (j = 0; j < (size_t)n_nested; j++) {
			mem_free(nested_lists[j]);
		}
		nested_lists = NULL;
	}
	n_nested = 0;
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++) {
		n_nested = MAX(n_nested, cmds_all[j].keymap);
	}
	if (n_nested > 0) {
		nested_lists = mem_zalloc(n_nested * sizeof(*nested_lists));
		for (j = 0; j < (size_t)n_nested; j++) {
			nested_lists[j] = mem_zalloc((UCHAR_MAX + 1) *
				sizeof(*(nested_lists[j])));
		}
	}

	/* Go through all generic commands (-1 for NULL end entry) */
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++)
	{
		struct cmd_info *commands = cmds_all[j].list;

		/* Fill everything in */
		if (cmds_all[j].keymap == 0) {
			for (i = 0; i < cmds_all[j].len; i++) {
				/* If a roguelike key isn't set, use default */
				if (!commands[i].key[1])
					commands[i].key[1] = commands[i].key[0];

				/* Skip entries that don't have a valid key. */
				if (!commands[i].key[0] || !commands[i].key[1])
					continue;

				converted_list[0][commands[i].key[0]] =
					&commands[i];
				converted_list[1][commands[i].key[1]] =
					&commands[i];
			}
		} else if (cmds_all[j].keymap > 0) {
			int kidx = cmds_all[j].keymap - 1;

			assert(kidx < n_nested);
			for (i = 0; i < cmds_all[j].len; i++) {
				/*
				 * Nested commands don't go through a keymap;
				 * use the default for the roguelike key.
				 */
				commands[i].key[1] = commands[i].key[0];

				/*
				 * Check for duplicated keys in the same
				 * command set.
				 */
				assert(!nested_lists[kidx][commands[i].key[0]]);

				nested_lists[kidx][commands[i].key[0]] =
					&commands[i];
			}
		}
	}
}